

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

size_t __thiscall
sentencepiece::ModelProto_SentencePiece::ByteSizeLong(ModelProto_SentencePiece *this)

{
  uint uVar1;
  ModelProto_SentencePiece_Type value;
  int size;
  string *value_00;
  size_t sVar2;
  InternalMetadata *this_00;
  long lVar3;
  int cached_size;
  uint32 cached_has_bits;
  size_t total_size;
  ModelProto_SentencePiece *this_local;
  
  _cached_size = google::protobuf::internal::ExtensionSet::ByteSize(&this->_extensions_);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      value_00 = _internal_piece_abi_cxx11_(this);
      sVar2 = google::protobuf::internal::WireFormatLite::StringSize(value_00);
      _cached_size = sVar2 + 1 + _cached_size;
    }
    if ((uVar1 & 2) != 0) {
      _cached_size = _cached_size + 5;
    }
    if ((uVar1 & 4) != 0) {
      value = _internal_type(this);
      sVar2 = google::protobuf::internal::WireFormatLite::EnumSize(value);
      _cached_size = sVar2 + 1 + _cached_size;
    }
  }
  if (((uint)(this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 1) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    if (((uint)this_00->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (this_00);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    lVar3 = std::__cxx11::string::size();
    _cached_size = lVar3 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t ModelProto_SentencePiece::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:sentencepiece.ModelProto.SentencePiece)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    // optional string piece = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_piece());
    }

    // optional float score = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 + 4;
    }

    // optional .sentencepiece.ModelProto.SentencePiece.Type type = 3 [default = NORMAL];
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_type());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}